

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_strategy ZVar1;
  U32 UVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar8;
  undefined4 uVar9;
  U32 *pUVar5;
  U32 *pUVar6;
  void *pvVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  ZSTD_compressionParameters cPar;
  U32 UVar16;
  uint uVar17;
  U32 end;
  int iVar18;
  uint uVar19;
  ZSTD_TraceCtx ZVar20;
  size_t sVar21;
  ulong uVar22;
  size_t sVar23;
  size_t sVar24;
  long lVar25;
  byte bVar26;
  uint uVar27;
  ZSTD_matchState_t *srcMatchState;
  long lVar28;
  size_t tagTableSize;
  size_t sVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  ZSTD_CCtx_params local_108;
  
  sVar21 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar21 = cdict->dictContentSize;
  }
  ZVar20 = duckdb_zstd::ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar20;
  if ((((cdict == (ZSTD_CDict *)0x0) || (sVar23 = cdict->dictContentSize, sVar23 == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((pledgedSrcSize != 0xffffffffffffffff && (sVar23 * 6 <= pledgedSrcSize)) &&
        (cdict->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad)) {
    sVar23 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar21,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar23) {
      return sVar23;
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      uVar30 = SUB84(cctx->entropyWorkspace,0);
      uVar31 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
    }
    else {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      uVar30 = SUB84(cctx->entropyWorkspace,0);
      uVar31 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      dictSize = cdict->dictContentSize;
    }
    sVar23 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&cctx->ldmState
                        ,&cctx->workspace,&cctx->appliedParams,dict,dictSize,dictContentType,dtlm,
                        ZSTD_tfp_forCCtx,(void *)CONCAT44(uVar31,uVar30));
    if (0xffffffffffffff88 < sVar23) {
      return sVar23;
    }
    cctx->dictID = (U32)sVar23;
    cctx->dictContentSize = sVar21;
  }
  else {
    iVar18 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
    if (iVar18 == 0) {
      switchD_00337c71::default(&local_108,params,0xd8);
      uVar10 = (cdict->matchState).cParams.chainLog;
      uVar11 = (cdict->matchState).cParams.hashLog;
      uVar12 = (cdict->matchState).cParams.searchLog;
      uVar13 = (cdict->matchState).cParams.minMatch;
      local_108.cParams.targetLength = (cdict->matchState).cParams.targetLength;
      local_108.cParams.strategy = (cdict->matchState).cParams.strategy;
      local_108.cParams.chainLog = uVar10;
      local_108.useRowMatchFinder = cdict->useRowMatchFinder;
      local_108.cParams.hashLog = uVar11;
      local_108.cParams.searchLog = uVar12;
      local_108.cParams.minMatch = uVar13;
      sVar21 = ZSTD_resetCCtx_internal(cctx,&local_108,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
      if (0xffffffffffffff88 < sVar21) {
        return sVar21;
      }
      (cctx->workspace).tableValidEnd = (cctx->workspace).objectEnd;
      ZVar1 = (cdict->matchState).cParams.strategy;
      if ((ZVar1 == ZSTD_fast) ||
         ((ZVar1 - ZSTD_greedy < 3 && (cdict->useRowMatchFinder == ZSTD_ps_enable)))) {
        lVar28 = 0;
      }
      else {
        lVar28 = 1L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
      }
      bVar26 = (byte)(cdict->matchState).cParams.hashLog;
      sVar29 = 1L << (bVar26 & 0x3f);
      pUVar5 = (cctx->blockState).matchState.hashTable;
      pUVar6 = (cdict->matchState).hashTable;
      if (ZVar1 - ZSTD_greedy < 0xfffffffe) {
        switchD_00337c71::default(pUVar5,pUVar6,4L << (bVar26 & 0x3f));
      }
      else {
        sVar24 = 0;
        do {
          pUVar5[sVar24] = pUVar6[sVar24] >> 8;
          sVar24 = sVar24 + 1;
        } while (sVar29 != sVar24);
      }
      ZVar1 = (cctx->appliedParams).cParams.strategy;
      if ((ZVar1 != ZSTD_fast) &&
         ((2 < ZVar1 - ZSTD_greedy || ((cctx->appliedParams).useRowMatchFinder != ZSTD_ps_enable))))
      {
        pUVar5 = (cctx->blockState).matchState.chainTable;
        pUVar6 = (cdict->matchState).chainTable;
        if ((cdict->matchState).cParams.strategy - ZSTD_greedy < 0xfffffffe) {
          switchD_00337c71::default(pUVar5,pUVar6,lVar28 << 2);
        }
        else if (lVar28 != 0) {
          lVar25 = 0;
          do {
            pUVar5[lVar25] = pUVar6[lVar25] >> 8;
            lVar25 = lVar25 + 1;
          } while (lVar28 != lVar25);
        }
      }
      if ((0xfffffffc < (cdict->matchState).cParams.strategy - ZSTD_btlazy2) &&
         (cdict->useRowMatchFinder == ZSTD_ps_enable)) {
        switchD_00337c71::default
                  ((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,sVar29);
        (cctx->blockState).matchState.hashSalt = (cdict->matchState).hashSalt;
      }
      UVar2 = (cctx->blockState).matchState.hashLog3;
      sVar29 = 0;
      if (UVar2 != 0) {
        sVar29 = 4L << ((byte)UVar2 & 0x3f);
      }
      memset((cctx->blockState).matchState.hashTable3,0,sVar29);
      pvVar7 = (cctx->workspace).tableEnd;
      if ((cctx->workspace).tableValidEnd < pvVar7) {
        (cctx->workspace).tableValidEnd = pvVar7;
      }
      uVar30 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
      (cctx->blockState).matchState.window.nbOverflowCorrections =
           (cdict->matchState).window.nbOverflowCorrections;
      *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar30;
      pBVar14 = (cdict->matchState).window.nextSrc;
      pBVar15 = (cdict->matchState).window.base;
      UVar2 = (cdict->matchState).window.dictLimit;
      UVar16 = (cdict->matchState).window.lowLimit;
      (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
      (cctx->blockState).matchState.window.dictLimit = UVar2;
      (cctx->blockState).matchState.window.lowLimit = UVar16;
      (cctx->blockState).matchState.window.nextSrc = pBVar14;
      (cctx->blockState).matchState.window.base = pBVar15;
      UVar2 = (cdict->matchState).nextToUpdate;
      (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
      (cctx->blockState).matchState.nextToUpdate = UVar2;
    }
    else {
      switchD_00337c71::default(&local_108,params,0xd8);
      uVar3 = (cdict->matchState).cParams.windowLog;
      uVar8 = (cdict->matchState).cParams.chainLog;
      cPar.chainLog = uVar8;
      cPar.windowLog = uVar3;
      uVar19 = (cdict->matchState).cParams.hashLog;
      ZVar1 = (cdict->matchState).cParams.strategy;
      uVar17 = local_108.cParams.windowLog;
      uVar27 = uVar19;
      if ((cdict->matchState).dedicatedDictSearch != 0) {
        uVar27 = 6;
        if (6 < uVar19 - 2) {
          uVar27 = uVar19 - 2;
        }
        if (2 < ZVar1 - ZSTD_greedy) {
          uVar27 = uVar19;
        }
      }
      uVar4 = (cdict->matchState).cParams.searchLog;
      uVar9 = (cdict->matchState).cParams.minMatch;
      cPar.hashLog = uVar27;
      cPar.searchLog = uVar4;
      cPar.minMatch = uVar9;
      cPar.targetLength = (cdict->matchState).cParams.targetLength;
      cPar.strategy = ZVar1;
      ZSTD_adjustCParams_internal
                (&local_108.cParams,cPar,pledgedSrcSize,sVar23,ZSTD_cpm_attachDict,
                 local_108.useRowMatchFinder);
      local_108.cParams._0_8_ = CONCAT44(local_108.cParams.chainLog,uVar17);
      local_108.useRowMatchFinder = cdict->useRowMatchFinder;
      sVar21 = ZSTD_resetCCtx_internal(cctx,&local_108,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
      if (0xffffffffffffff88 < sVar21) {
        return sVar21;
      }
      uVar22 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
      uVar19 = (uint)uVar22;
      if ((cdict->matchState).window.dictLimit != uVar19) {
        (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
        if ((cctx->blockState).matchState.window.dictLimit < uVar19) {
          (cctx->blockState).matchState.window.nextSrc =
               (cctx->blockState).matchState.window.base + (uVar22 & 0xffffffff);
          (cctx->blockState).matchState.window.lowLimit = uVar19;
          (cctx->blockState).matchState.window.dictLimit = uVar19;
        }
        (cctx->blockState).matchState.loadedDictEnd = (cctx->blockState).matchState.window.dictLimit
        ;
      }
    }
    cctx->dictID = cdict->dictID;
    cctx->dictContentSize = cdict->dictContentSize;
    switchD_00337c71::default((cctx->blockState).prevCBlock,&cdict->cBlockState,0x1600);
  }
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}